

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_acid_vein(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  OBJ_DATA *obj;
  char *txt;
  OBJ_AFFECT_DATA oaf;
  char arg [4608];
  
  target_name = one_argument(target_name,arg);
  obj = get_obj_carry(ch,arg,ch);
  if (obj == (OBJ_DATA *)0x0) {
    txt = "You aren\'t carrying that.\n\r";
  }
  else if (obj->item_type == 5) {
    bVar1 = is_affected_obj(obj,(int)gsn_acid_vein);
    if (!bVar1) {
      init_affect_obj(&oaf);
      oaf.where = 0;
      oaf.aftype = 0;
      oaf.location = 4;
      oaf.modifier = 0x1f - (short)obj->value[3];
      oaf.level = (short)level;
      oaf.duration = oaf.level * 3;
      oaf.end_fun = acid_end;
      oaf.owner = ch;
      oaf.type = (short)sn;
      affect_to_obj(obj,&oaf);
      act("You coat $p with acid.",ch,obj,(void *)0x0,3);
      WAIT_STATE(ch,0x18);
      return;
    }
    txt = "This weapon is already coated with acid!\n\r";
  }
  else {
    txt = "You can only cast this on weapons.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_acid_vein(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg[MSL];
	OBJ_DATA *weapon;
	OBJ_AFFECT_DATA oaf;

	target_name = one_argument(target_name, arg);

	weapon = get_obj_carry(ch, arg, ch);

	if (weapon == nullptr)
	{
		send_to_char("You aren't carrying that.\n\r", ch);
		return;
	}

	if (weapon->item_type != ITEM_WEAPON)
	{
		send_to_char("You can only cast this on weapons.\n\r", ch);
		return;
	}

	if (is_affected_obj(weapon, gsn_acid_vein))
	{
		send_to_char("This weapon is already coated with acid!\n\r", ch);
		return;
	}

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = sn;
	oaf.aftype = AFT_SPELL;
	oaf.location = APPLY_OBJ_V3;
	oaf.modifier = 31 - weapon->value[3];
	oaf.duration = level * 3;
	oaf.end_fun = acid_end;
	oaf.level = level;
	oaf.owner = ch;
	affect_to_obj(weapon, &oaf);

	act("You coat $p with acid.", ch, weapon, 0, TO_CHAR);
	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}